

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

Leaf * __thiscall
kj::_::BTreeImpl::eraseHelper<kj::_::BTreeImpl::Leaf>
          (BTreeImpl *this,Leaf *node,Parent *parent,uint indexInParent,uint pos,MaybeUint **fixup)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  Leaf *pLVar4;
  Fault local_90;
  Fault f_5;
  Fault f_4;
  Fault f_3;
  Leaf *sib_1;
  uint sibPos_1;
  Fault f_2;
  Fault f_1;
  Leaf *sib;
  uint sibPos;
  Fault local_40;
  Fault f;
  MaybeUint **fixup_local;
  uint pos_local;
  uint indexInParent_local;
  Parent *parent_local;
  Leaf *node_local;
  BTreeImpl *this_local;
  
  this_local = (BTreeImpl *)node;
  if ((parent != (Parent *)0x0) &&
     (f.exception = (Exception *)fixup, bVar2 = Leaf::isMostlyFull(node), !bVar2)) {
    bVar2 = Leaf::isHalfFull(node);
    if (!bVar2) {
      Debug::Fault::Fault(&local_40,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                          ,0x214,FAILED,"node.isHalfFull()","");
      Debug::Fault::fatal(&local_40);
    }
    if (indexInParent == 0) {
      bVar2 = MaybeUint::operator!=(parent->keys,(void *)0x0);
      if (!bVar2) {
        Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20]>
                  (&local_90,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                   ,0x24f,FAILED,(char *)0x0,"\"inconsistent b-tree\"",
                   (char (*) [20])"inconsistent b-tree");
        Debug::Fault::fatal(&local_90);
      }
      uVar1 = parent->children[1];
      pLVar4 = NodeUnion::operator_cast_to_Leaf_(this->tree + uVar1);
      bVar2 = Leaf::isMostlyFull(pLVar4);
      if (bVar2) {
        rotateLeft(this,node,pLVar4,parent,0,(MaybeUint **)f.exception);
      }
      else {
        bVar2 = Leaf::isHalfFull(pLVar4);
        if (!bVar2) {
          Debug::Fault::Fault(&f_4,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                              ,0x23c,FAILED,"sib.isHalfFull()","");
          Debug::Fault::fatal(&f_4);
        }
        uVar3 = MaybeUint::operator*(parent->keys);
        merge(this,node,pos,uVar3,pLVar4);
        Parent::eraseAfter(parent,0);
        free(this,(void *)(ulong)uVar1);
        if ((MaybeUint *)((f.exception)->ownFile).content.ptr == parent->keys) {
          ((f.exception)->ownFile).content.ptr = (char *)0x0;
        }
        bVar2 = MaybeUint::operator==(parent->keys,(void *)0x0);
        if (bVar2) {
          if (parent != (Parent *)this->tree) {
            Debug::Fault::Fault(&f_5,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                                ,0x244,FAILED,"parent == &tree->parent","");
            Debug::Fault::fatal(&f_5);
          }
          compilerBarrier();
          pLVar4 = NodeUnion::operator_cast_to_Leaf_(this->tree);
          move(this,pLVar4,0,node);
          free(this,(void *)(ulong)pos);
          this->height = this->height - 1;
          this_local = (BTreeImpl *)NodeUnion::operator_cast_to_Leaf_(this->tree);
        }
      }
    }
    else {
      uVar1 = parent->children[indexInParent - 1];
      this_local = (BTreeImpl *)NodeUnion::operator_cast_to_Leaf_(this->tree + uVar1);
      bVar2 = Leaf::isMostlyFull((Leaf *)this_local);
      if (bVar2) {
        rotateRight(this,(Leaf *)this_local,node,parent,indexInParent - 1);
        this_local = (BTreeImpl *)node;
      }
      else {
        bVar2 = Leaf::isHalfFull((Leaf *)this_local);
        if (!bVar2) {
          Debug::Fault::Fault(&f_2,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                              ,0x220,FAILED,"sib.isHalfFull()","");
          Debug::Fault::fatal(&f_2);
        }
        uVar3 = MaybeUint::operator*(parent->keys + (indexInParent - 1));
        merge(this,(Leaf *)this_local,uVar1,uVar3,node);
        Parent::eraseAfter(parent,indexInParent - 1);
        free(this,(void *)(ulong)pos);
        if ((MaybeUint *)((f.exception)->ownFile).content.ptr == parent->keys + indexInParent) {
          ((f.exception)->ownFile).content.ptr = ((f.exception)->ownFile).content.ptr + -4;
        }
        bVar2 = MaybeUint::operator==(parent->keys,(void *)0x0);
        if (bVar2) {
          if (parent != (Parent *)this->tree) {
            Debug::Fault::Fault((Fault *)&stack0xffffffffffffff98,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                                ,0x228,FAILED,"parent == &tree->parent","");
            Debug::Fault::fatal((Fault *)&stack0xffffffffffffff98);
          }
          compilerBarrier();
          pLVar4 = NodeUnion::operator_cast_to_Leaf_(this->tree);
          move(this,pLVar4,0,(Leaf *)this_local);
          free(this,(void *)(ulong)uVar1);
          this->height = this->height - 1;
          this_local = (BTreeImpl *)NodeUnion::operator_cast_to_Leaf_(this->tree);
        }
      }
    }
  }
  return (Leaf *)this_local;
}

Assistant:

Node& BTreeImpl::eraseHelper(
    Node& node, Parent* parent, uint indexInParent, uint pos, MaybeUint*& fixup) {
  if (parent != nullptr && !node.isMostlyFull()) {
    // This is not the root, but it's only half-full. Rebalance.
    KJ_DASSERT(node.isHalfFull());

    if (indexInParent > 0) {
      // There's a sibling to the left.
      uint sibPos = parent->children[indexInParent - 1];
      Node& sib = tree[sibPos];
      if (sib.isMostlyFull()) {
        // Left sibling is more than half full. Steal one member.
        rotateRight(sib, node, *parent, indexInParent - 1);
        return node;
      } else {
        // Left sibling is half full, too. Merge.
        KJ_ASSERT(sib.isHalfFull());
        merge(sib, sibPos, *parent->keys[indexInParent - 1], node);
        parent->eraseAfter(indexInParent - 1);
        free(pos);
        if (fixup == &parent->keys[indexInParent]) --fixup;

        if (parent->keys[0] == nullptr) {
          // Oh hah, the parent has no keys left. It must be the root. We can eliminate it.
          KJ_DASSERT(parent == &tree->parent);
          compilerBarrier();  // don't reorder any writes to parent below here
          move(tree[0], 0, sib);
          free(sibPos);
          --height;
          return tree[0];
        } else {
          return sib;
        }
      }
    } else if (indexInParent < Parent::NKEYS && parent->keys[indexInParent] != nullptr) {
      // There's a sibling to the right.
      uint sibPos = parent->children[indexInParent + 1];
      Node& sib = tree[sibPos];
      if (sib.isMostlyFull()) {
        // Right sibling is more than half full. Steal one member.
        rotateLeft(node, sib, *parent, indexInParent, fixup);
        return node;
      } else {
        // Right sibling is half full, too. Merge.
        KJ_ASSERT(sib.isHalfFull());
        merge(node, pos, *parent->keys[indexInParent], sib);
        parent->eraseAfter(indexInParent);
        free(sibPos);
        if (fixup == &parent->keys[indexInParent]) fixup = nullptr;

        if (parent->keys[0] == nullptr) {
          // Oh hah, the parent has no keys left. It must be the root. We can eliminate it.
          KJ_DASSERT(parent == &tree->parent);
          compilerBarrier();  // don't reorder any writes to parent below here
          move(tree[0], 0, node);
          free(pos);
          --height;
          return tree[0];
        } else {
          return node;
        }
      }
    } else {
      KJ_FAIL_ASSERT("inconsistent b-tree");
    }
  }

  return node;
}